

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

bool __thiscall FIX::BoolField::getValue(BoolField *this)

{
  bool bVar1;
  string *value;
  FieldConvertError *anon_var_0;
  BoolField *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  bVar1 = BoolConvertor::convert(value);
  return bVar1;
}

Assistant:

bool getValue() const EXCEPT ( IncorrectDataFormat )
    { try
      { return BoolConvertor::convert( getString() ); }
      catch( FieldConvertError& )
      { throw IncorrectDataFormat( getTag(), getString() ); } }